

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetNavWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  char *pcVar3;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != window) {
    if ((GImGui->DebugLogFlags & 2) != 0) {
      if (window == (ImGuiWindow *)0x0) {
        pcVar3 = "<NULL>";
      }
      else {
        pcVar3 = window->Name;
      }
      DebugLog("[focus] SetNavWindow(\"%s\")\n",pcVar3);
    }
    pIVar1->NavWindow = window;
  }
  pIVar1->NavMoveSubmitted = false;
  pIVar1->NavMoveScoringItems = false;
  pIVar1->NavInitRequest = false;
  bVar2 = true;
  if (GImGui->NavMoveScoringItems == false) {
    bVar2 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar2;
  return;
}

Assistant:

void ImGui::SetNavWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window)
    {
        IMGUI_DEBUG_LOG_FOCUS("[focus] SetNavWindow(\"%s\")\n", window ? window->Name : "<NULL>");
        g.NavWindow = window;
    }
    g.NavInitRequest = g.NavMoveSubmitted = g.NavMoveScoringItems = false;
    NavUpdateAnyRequestFlag();
}